

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O0

boolean cursed_book(obj *bp)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int local_44;
  int local_40;
  char *local_38;
  int lev;
  obj *bp_local;
  
  iVar2 = rn2((int)objects[bp->otyp].oc_oc2);
  uVar1 = u.uprops[0x1e].intrinsic;
  switch(iVar2) {
  case 0:
    pline("You feel a wrenching sensation.");
    tele((char *)0x0);
    break;
  case 1:
    pline("You feel threatened.");
    aggravate();
    break;
  case 2:
    iVar2 = rn2(100);
    make_blinded((ulong)(uVar1 + iVar2 + 0xfa),'\x01');
    break;
  case 3:
    take_gold();
    break;
  case 4:
    pline("These runes were just too much to comprehend.");
    uVar1 = u.uprops[0x1c].intrinsic;
    iVar2 = rn2(7);
    make_confused((ulong)(uVar1 + iVar2 + 0x10),'\0');
    break;
  case 5:
    pline("The book was coated with contact poison!");
    if (uarmg == (obj *)0x0) {
      *(uint *)&bp->field_0x4a = *(uint *)&bp->field_0x4a & 0xff7fffff;
      if (((u.uprops[6].intrinsic == 0) && (u.uprops[6].extrinsic == 0)) &&
         ((youmonst.mintrinsics & 0x20) == 0)) {
        local_40 = rn2(4);
        local_40 = local_40 + 3;
      }
      else {
        local_40 = rn2(2);
        local_40 = local_40 + 1;
      }
      losestr(local_40,'\0');
      if ((((u.uprops[6].intrinsic == 0) && (u.uprops[6].extrinsic == 0)) &&
          ((youmonst.mintrinsics & 0x20) == 0)) ||
         ((((u.uprops[6].intrinsic & 0x4000000) != 0 && ((u.uprops[6].intrinsic & 0xfbffffff) == 0))
          && ((u.uprops[6].extrinsic == 0 && ((youmonst.mintrinsics & 0x20) == 0)))))) {
        bVar4 = false;
        if ((((u.uprops[6].intrinsic & 0x4000000) != 0) &&
            (bVar4 = false, (u.uprops[6].intrinsic & 0xfbffffff) == 0)) &&
           (bVar4 = false, u.uprops[6].extrinsic == 0)) {
          bVar4 = (youmonst.mintrinsics & 0x20) == 0;
        }
        local_44 = 10;
        if (bVar4) {
          local_44 = 8;
        }
      }
      else {
        local_44 = 6;
      }
      iVar2 = rnd(local_44);
      losehp(iVar2,"contact-poisoned spellbook",0);
      *(uint *)&bp->field_0x4a = *(uint *)&bp->field_0x4a & 0xff7fffff | 0x800000;
    }
    else if (((*(uint *)&uarmg->field_0x4a >> 0xc & 1) == 0) &&
            (((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) == 0xd ||
             ((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) == 0xb)))) {
      if ((*(uint *)&uarmg->field_0x4a >> 10 & 3) < 3) {
        if ((*(uint *)&uarmg->field_0x4a >> 0x14 & 1) == 0) {
          if ((*(uint *)&uarmg->field_0x4a >> 10 & 3) == 2) {
            local_38 = " completely";
          }
          else {
            local_38 = "";
            if ((*(uint *)&uarmg->field_0x4a >> 10 & 3) != 0) {
              local_38 = " further";
            }
          }
          pline("Your gloves corrode%s!",local_38);
          *(uint *)&uarmg->field_0x4a =
               *(uint *)&uarmg->field_0x4a & 0xfffff3ff |
               ((*(uint *)&uarmg->field_0x4a >> 10 & 3) + 1 & 3) << 10;
        }
        else {
          grease_protect(uarmg,"gloves",&youmonst);
        }
      }
      else {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (bVar4 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
          bVar4 = false;
          if (ublindf != (obj *)0x0) {
            bVar4 = ublindf->oartifact == '\x1d';
          }
          bVar4 = (bool)(bVar4 ^ 1);
        }
        pcVar3 = "look";
        if (bVar4) {
          pcVar3 = "feel";
        }
        pline("Your gloves %s completely corroded.",pcVar3);
      }
    }
    else {
      pline("Your gloves seem unaffected.");
    }
    break;
  case 6:
    pcVar3 = body_part(2);
    pline("As you read the book, it %s in your %s!","radiates explosive energy",pcVar3);
    iVar2 = rnd(10);
    mana_damageu(iVar2 * 2 + 5,(monst *)0x0,"exploding rune",0,'\0');
    return '\x01';
  default:
    rndcurse();
  }
  return '\0';
}

Assistant:

static boolean cursed_book(struct obj *bp)
{
	int lev = objects[bp->otyp].oc_level;

	switch(rn2(lev)) {
	case 0:
		pline("You feel a wrenching sensation.");
		tele(NULL);		/* teleport him */
		break;
	case 1:
		pline("You feel threatened.");
		aggravate();
		break;
	case 2:
		make_blinded(Blinded + rn1(100,250),TRUE);
		break;
	case 3:
		take_gold();
		break;
	case 4:
		pline("These runes were just too much to comprehend.");
		make_confused(HConfusion + rn1(7,16),FALSE);
		break;
	case 5:
		pline("The book was coated with contact poison!");
		if (uarmg) {
		    if (uarmg->oerodeproof || !is_corrodeable(uarmg)) {
			pline("Your gloves seem unaffected.");
		    } else if (uarmg->oeroded2 < MAX_ERODE) {
			if (uarmg->greased) {
			    grease_protect(uarmg, "gloves", &youmonst);
			} else {
			    pline("Your gloves corrode%s!",
				 uarmg->oeroded2+1 == MAX_ERODE ?
				 " completely" : uarmg->oeroded2 ?
				 " further" : "");
			    uarmg->oeroded2++;
			}
		    } else
			pline("Your gloves %s completely corroded.",
			     Blind ? "feel" : "look");
		    break;
		}
		/* temp disable in_use; death should not destroy the book */
		bp->in_use = FALSE;
		losestr(Poison_resistance ? rn1(2,1) : rn1(4,3), FALSE);
		losehp(rnd(FPoison_resistance ? 6 :
			   PPoison_resistance ? 8 : 10),
		       "contact-poisoned spellbook", KILLED_BY_AN);
		bp->in_use = TRUE;
		break;
	case 6:
		pline("As you read the book, it %s in your %s!",
		      explodes, body_part(FACE));
		mana_damageu(2 * rnd(10) + 5, NULL,
			     "exploding rune", KILLED_BY_AN, FALSE);
		return TRUE;
	default:
		rndcurse();
		break;
	}
	return FALSE;
}